

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::UpgradeWallet(CWallet *this,int version,bilingual_str *error)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  reference ppSVar5;
  WalletFeature *in_RDX;
  uint in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  int prev_version;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  bilingual_str *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  WalletFeature in_stack_fffffffffffffe14;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  undefined8 in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe38;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int iVar6;
  WalletFeature *in_stack_fffffffffffffe50;
  ConstevalStringLiteral in_stack_fffffffffffffe58;
  WalletBatch *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  WalletFeature nVersion;
  ConstevalFormatString<1U> wallet_fmt;
  undefined7 in_stack_fffffffffffffe90;
  byte in_stack_fffffffffffffe97;
  bilingual_str *in_stack_fffffffffffffe98;
  uint local_14c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet_fmt.fmt = in_RDI;
  uVar3 = GetVersion((CWallet *)
                     CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
  if (in_ESI == 0) {
    in_stack_fffffffffffffe78 = "Performing wallet upgrade to %i\n";
    WalletLogPrintf<wallet::WalletFeature>
              ((CWallet *)in_stack_fffffffffffffe58.lit,wallet_fmt,in_stack_fffffffffffffe50);
    local_14c = 0x297ac;
  }
  else {
    in_stack_fffffffffffffe70 = "Allowing wallet upgrade up to %i\n";
    WalletLogPrintf<int>
              ((CWallet *)in_stack_fffffffffffffe58.lit,wallet_fmt,(int *)in_stack_fffffffffffffe50)
    ;
    local_14c = in_ESI;
  }
  if ((int)local_14c < (int)uVar3) {
    ::_(in_stack_fffffffffffffe58);
    tinyformat::format<int,int>
              ((bilingual_str *)wallet_fmt.fmt,(int *)in_RDX,(int *)in_stack_fffffffffffffe78);
    bilingual_str::operator=
              ((bilingual_str *)
               CONCAT17(in_stack_fffffffffffffe1f,
                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),
               (bilingual_str *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe97 = 0;
  }
  else {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe08);
    nVersion = (WalletFeature)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_RDI,
               (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
    iVar6 = (int)in_stack_fffffffffffffe28;
    bVar2 = CanSupportFeature((CWallet *)
                              CONCAT17(in_stack_fffffffffffffe1f,
                                       CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)
                                      ),in_stack_fffffffffffffe14);
    if (((bVar2) || ((int)local_14c < 0x2227c)) || (0x297ab < (int)local_14c)) {
      GetClosestWalletFeature(iVar6);
      SetMinVersion((CWallet *)in_stack_fffffffffffffe70,nVersion,in_stack_fffffffffffffe68);
      GetActiveScriptPubKeyMans((CWallet *)wallet_fmt.fmt);
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
               *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
             *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      while( true ) {
        bVar2 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffe1f,
                                                  CONCAT16(in_stack_fffffffffffffe1e,
                                                           in_stack_fffffffffffffe18)),
                                (_Self *)CONCAT44(in_stack_fffffffffffffe14,
                                                  in_stack_fffffffffffffe10));
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        ppSVar5 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                            ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                             in_stack_fffffffffffffe08);
        uVar4 = (*(*ppSVar5)->_vptr_ScriptPubKeyMan[0xe])
                          (*ppSVar5,(ulong)uVar3,(ulong)local_14c,in_RDX);
        in_stack_fffffffffffffe1f = (undefined1)uVar4;
        if ((uVar4 & 1) == 0) {
          in_stack_fffffffffffffe97 = 0;
          iVar6 = 1;
          goto LAB_0171108c;
        }
        std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
                  ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_fffffffffffffe08);
      }
      iVar6 = 2;
LAB_0171108c:
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)in_stack_fffffffffffffe08);
      if (iVar6 == 2) {
        in_stack_fffffffffffffe97 = 1;
      }
    }
    else {
      ::_(in_stack_fffffffffffffe58);
      tinyformat::format<int,int,wallet::WalletFeature>
                (in_stack_fffffffffffffe98,
                 (int *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (int *)wallet_fmt.fmt,in_RDX);
      bilingual_str::operator=
                ((bilingual_str *)
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),
                 (bilingual_str *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe97 = 0;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe08);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(in_stack_fffffffffffffe97 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::UpgradeWallet(int version, bilingual_str& error)
{
    int prev_version = GetVersion();
    if (version == 0) {
        WalletLogPrintf("Performing wallet upgrade to %i\n", FEATURE_LATEST);
        version = FEATURE_LATEST;
    } else {
        WalletLogPrintf("Allowing wallet upgrade up to %i\n", version);
    }
    if (version < prev_version) {
        error = strprintf(_("Cannot downgrade wallet from version %i to version %i. Wallet version unchanged."), prev_version, version);
        return false;
    }

    LOCK(cs_wallet);

    // Do not upgrade versions to any version between HD_SPLIT and FEATURE_PRE_SPLIT_KEYPOOL unless already supporting HD_SPLIT
    if (!CanSupportFeature(FEATURE_HD_SPLIT) && version >= FEATURE_HD_SPLIT && version < FEATURE_PRE_SPLIT_KEYPOOL) {
        error = strprintf(_("Cannot upgrade a non HD split wallet from version %i to version %i without upgrading to support pre-split keypool. Please use version %i or no version specified."), prev_version, version, FEATURE_PRE_SPLIT_KEYPOOL);
        return false;
    }

    // Permanently upgrade to the version
    SetMinVersion(GetClosestWalletFeature(version));

    for (auto spk_man : GetActiveScriptPubKeyMans()) {
        if (!spk_man->Upgrade(prev_version, version, error)) {
            return false;
        }
    }
    return true;
}